

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O0

int testMMapFileReaderTestsReadData(void)

{
  bool bVar1;
  string *psVar2;
  const_pointer p;
  size_type size;
  uint64_t uVar3;
  ostream *poVar4;
  SpanSize<18446744073709551615UL> in_RCX;
  Span<const_char,_18446744073709551615UL> data;
  Span<const_unsigned_char,_18446744073709551615UL> span_2;
  Span<const_char,_18446744073709551615UL> expectedSpan_2;
  Span<const_unsigned_char,_18446744073709551615UL> span_1;
  Span<const_char,_18446744073709551615UL> expectedSpan_1;
  string_view expected_1;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_char,_18446744073709551615UL> expectedSpan;
  string_view expected;
  range_error *anon_var_0_1;
  bool caughtCorrectException_1;
  range_error *anon_var_0;
  undefined1 local_a8 [3];
  bool caughtCorrectException;
  MMapFileReader reader;
  pointer local_60;
  undefined1 local_48 [8];
  string_view fileData;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&fileData._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_48,"salut! ca va?");
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&fileData._M_str);
  p = std::basic_string_view<char,_std::char_traits<char>_>::data
                ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  size = std::basic_string_view<char,_std::char_traits<char>_>::size
                   ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
  MILBlob::Util::Span<const_char,_18446744073709551615UL>::Span<18446744073709551615UL,_0>
            ((Span<const_char,_18446744073709551615UL> *)&reader.m_isEncrypted,p,size);
  data.m_size.m_size = in_RCX.m_size;
  data.m_ptr = local_60;
  MILBlob::TestUtil::WriteBlobFile<char_const,18446744073709551615ul>
            ((TestUtil *)psVar2,(string *)reader._56_8_,data);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&fileData._M_str);
  MILBlob::Blob::MMapFileReader::MMapFileReader((MMapFileReader *)local_a8,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength((MMapFileReader *)local_a8);
  if (uVar3 == 0xd) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted((MMapFileReader *)local_a8);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2e);
      poVar4 = std::operator<<(poVar4,": error: ");
      poVar4 = std::operator<<(poVar4,"!(reader.IsEncrypted())");
      poVar4 = std::operator<<(poVar4," was false, expected true.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      MILBlob::Blob::MMapFileReader::ReadData((MMapFileReader *)local_a8,0,0xe);
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x30);
      std::operator<<(poVar4,": expected exception, but none thrown.\n");
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x2d);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"(reader.GetLength()) == (uint64_t(13))");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  MILBlob::Blob::MMapFileReader::~MMapFileReader((MMapFileReader *)local_a8);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&fileData._M_str)
  ;
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadData()
{
    AutoDeleteTempFile tempfile;

    std::string_view fileData("salut! ca va?");
    TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::Span<const char>(fileData.data(), fileData.size()));

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(13));
    ML_ASSERT_NOT(reader.IsEncrypted());

    ML_ASSERT_THROWS(reader.ReadData(0, 14), std::range_error);
    ML_ASSERT_THROWS(reader.ReadData(13, 1), std::range_error);

    {
        std::string_view expected("salut");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(0, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        std::string_view expected("ca va");
        Util::Span<const char> expectedSpan(expected.data(), expected.size());

        auto span = reader.ReadData(7, 5);
        ML_ASSERT_SPAN_EQ(span, expected);
    }

    {
        Util::Span<const char> expectedSpan(fileData.data(), fileData.size());

        auto span = reader.ReadData(0, reader.GetLength());
        ML_ASSERT_SPAN_EQ(span, expectedSpan);
    }

    return 0;
}